

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqlite_open(unqlite **ppDB,char *zFilename,uint iMode)

{
  unqlite_vfs *puVar1;
  char *pcVar2;
  sxi32 sVar3;
  unqlite *pDb;
  ulong uVar4;
  char *pcVar5;
  unqlite_kv_methods *pMethods;
  char *pcVar6;
  Pager *pPager;
  Pager *pPVar7;
  Page **__s;
  jx9 *pBackend;
  Pager *pPVar8;
  Pager *pPVar9;
  void *pUserData;
  uint uVar10;
  uint uVar11;
  uint nLen;
  ProcRandomSeed xSeed;
  int iVar12;
  uint nByte;
  int local_60;
  
  *ppDB = (unqlite *)0x0;
  sVar3 = unqliteCoreInitialize();
  if (sVar3 != 0) {
    return sVar3;
  }
  pDb = (unqlite *)SyMemBackendPoolAlloc(&sUnqlMPGlobal.sAllocator,0x118);
  if (pDb == (unqlite *)0x0) {
    return -1;
  }
  uVar4 = 0xfffffffffffffffc;
  do {
    *(undefined4 *)((long)(pDb->sMem).apPool + (uVar4 - 0x3c)) = 0;
    uVar4 = uVar4 + 4;
  } while (uVar4 < 0x114);
  uVar10 = 0x101;
  if (iMode != 0) {
    uVar10 = iMode;
  }
  SyMemBackendInitFromParent((SyMemBackend *)pDb,&sUnqlMPGlobal.sAllocator);
  (pDb->sErr).pBlob = (void *)0x0;
  (pDb->sErr).nByte = 0;
  (pDb->sErr).mByte = 0;
  (pDb->sErr).pAllocator = (SyMemBackend *)pDb;
  (pDb->sErr).nFlags = 0;
  puVar1 = sUnqlMPGlobal.pVfs;
  uVar11 = uVar10 & 0xfffffff7 | 0x44;
  if ((uVar10 & 0x10) == 0) {
    uVar11 = uVar10 & 0xfffffff7;
  }
  uVar10 = uVar11 | 2;
  if ((uVar11 & 3) != 0) {
    uVar10 = uVar11;
  }
  if ((uVar10 & 4) == 0) {
    if ((uVar10 & 1) == 0) {
      if ((uVar10 & 2) != 0) {
        uVar10 = uVar10 & 0xfffffef2;
      }
      uVar4 = (ulong)uVar10;
    }
    else {
      uVar4 = (ulong)(uVar10 & 0xfffffff1);
    }
  }
  else {
    uVar4 = (ulong)(uVar10 & 0xfffffef4 | 2);
  }
  local_60 = (int)zFilename;
  if (((zFilename == (char *)0x0) || ((uVar4 & 0x80) != 0)) || (*zFilename == '\0')) {
LAB_0010aee5:
    pMethods = unqliteFindKVStore("mem",3);
    uVar4 = (ulong)((uint)uVar4 | 0x80);
  }
  else {
    pcVar6 = zFilename + 2;
    do {
      pcVar5 = pcVar6;
      if (pcVar5[-1] == '\0') {
        pcVar5 = pcVar5 + -1;
        goto LAB_0010ae71;
      }
      if (*pcVar5 == '\0') goto LAB_0010ae71;
      if (pcVar5[1] == '\0') {
        pcVar5 = pcVar5 + 1;
        goto LAB_0010ae71;
      }
      pcVar6 = pcVar5 + 4;
    } while (pcVar5[2] != '\0');
    pcVar5 = pcVar5 + 2;
LAB_0010ae71:
    iVar12 = (int)pcVar5 - local_60;
    if (iVar12 == 8) {
      iVar12 = SyStrnicmp(zFilename,":memory:",8);
joined_r0x0010aeba:
      if (iVar12 == 0) goto LAB_0010aee5;
    }
    else if (iVar12 == 5) {
      iVar12 = SyStrnicmp(zFilename,":mem:",5);
      goto joined_r0x0010aeba;
    }
    pMethods = unqliteFindKVStore("hash",4);
    if (pMethods == (unqlite_kv_methods *)0x0) {
      pMethods = unqliteFindKVStore("btree",5);
    }
  }
  if (pMethods == (unqlite_kv_methods *)0x0) {
    unqliteGenError(pDb,"Cannot install a default Key/Value storage engine");
    sVar3 = -0x11;
    goto LAB_0010b1ce;
  }
  uVar11 = (uint)uVar4;
  uVar10 = 1;
  if ((uVar4 & 0x80) == 0) {
    uVar10 = (uint)(uVar4 >> 6) & 1;
  }
  if ((uVar4 & 0x80) == 0) {
    pcVar6 = zFilename;
    if (*zFilename != '\0') {
      pcVar5 = zFilename + 2;
      do {
        pcVar6 = pcVar5;
        if (pcVar6[-1] == '\0') {
          pcVar6 = pcVar6 + -1;
          goto LAB_0010af9f;
        }
        if (*pcVar6 == '\0') goto LAB_0010af9f;
        if (pcVar6[1] == '\0') {
          pcVar6 = pcVar6 + 1;
          goto LAB_0010af9f;
        }
        pcVar5 = pcVar6 + 4;
      } while (pcVar6[2] != '\0');
      pcVar6 = pcVar6 + 2;
    }
LAB_0010af9f:
    nLen = (int)pcVar6 - local_60;
    nByte = puVar1->mxPathname + nLen + 0x261;
  }
  else {
    nLen = 0;
    nByte = 0x260;
  }
  pPager = (Pager *)SyMemBackendAlloc((SyMemBackend *)pDb,nByte);
  if (pPager == (Pager *)0x0) {
    sVar3 = -1;
    goto LAB_0010b1ce;
  }
  if (nByte != 0) {
    pPVar7 = (Pager *)((pPager->sPrng).s + ((ulong)nByte - 0x66));
    pPVar8 = pPager;
    do {
      *(undefined1 *)&pPVar8->pAllocator = 0;
      pPVar9 = (Pager *)((long)&pPVar8->pAllocator + 1);
      if (pPVar7 <= pPVar9) break;
      *(undefined1 *)&pPVar9->pAllocator = 0;
      pPVar9 = (Pager *)((long)&pPVar8->pAllocator + 2);
      if (pPVar7 <= pPVar9) break;
      *(undefined1 *)&pPVar9->pAllocator = 0;
      pPVar9 = (Pager *)((long)&pPVar8->pAllocator + 3);
      if (pPVar7 <= pPVar9) break;
      *(undefined1 *)&pPVar9->pAllocator = 0;
      pPVar8 = (Pager *)((long)&pPVar8->pAllocator + 4);
    } while (pPVar8 < pPVar7);
  }
  pPager->pAllocator = (SyMemBackend *)pDb;
  pPager->pDb = pDb;
  (pDb->sDB).pPager = pPager;
  pPager->nSize = 0x80;
  __s = (Page **)SyMemBackendAlloc((SyMemBackend *)pDb,0x400);
  pPager->apHash = __s;
  sVar3 = -1;
  if (__s != (Page **)0x0) {
    xSeed = (ProcRandomSeed)0x0;
    memset(__s,0,0x400);
    pPager->is_mem = (uVar11 & 0x80) >> 7;
    pPager->no_jrnl = uVar10;
    pPager->is_rdonly = uVar11 & 1;
    pPager->iOpenFlags = uVar11;
    pPager->pVfs = puVar1;
    SyRandomnessInit(&pPager->sPrng,xSeed,pUserData);
    SyRandomness(&pPager->sPrng,&pPager->cksumInit,4);
    pPager->nCacheMax = 0xffffffff;
    if ((uVar4 & 0x80) == 0) {
      pPager->zFilename = (char *)(pPager + 1);
      if ((puVar1->xFullPathname == (_func_int_unqlite_vfs_ptr_char_ptr_int_char_ptr *)0x0) ||
         (iVar12 = (*puVar1->xFullPathname)
                             (puVar1,zFilename,puVar1->mxPathname + nLen,(char *)(pPager + 1)),
         iVar12 == 0)) {
        pcVar6 = pPager->zFilename;
        pcVar5 = pcVar6;
        if (*pcVar6 != '\0') {
          pcVar2 = pcVar6 + 2;
          do {
            pcVar5 = pcVar2;
            if (pcVar5[-1] == '\0') {
              pcVar5 = pcVar5 + -1;
              goto LAB_0010b163;
            }
            if (*pcVar5 == '\0') goto LAB_0010b163;
            if (pcVar5[1] == '\0') {
              pcVar5 = pcVar5 + 1;
              goto LAB_0010b163;
            }
            pcVar2 = pcVar5 + 4;
          } while (pcVar5[2] != '\0');
          pcVar5 = pcVar5 + 2;
        }
LAB_0010b163:
        nLen = (int)pcVar5 - (int)pcVar6;
      }
      else {
        SyMemcpy(zFilename,pPager->zFilename,nLen);
        pPager->zFilename[nLen] = '\0';
      }
      pcVar6 = (char *)SyMemBackendAlloc(pPager->pAllocator,nLen + 0x12);
      pPager->zJournal = pcVar6;
      if (pcVar6 == (char *)0x0) goto LAB_0010b1c3;
      SyMemcpy(pPager->zFilename,pcVar6,nLen);
      SyMemcpy("_unqlite_journal",pPager->zJournal + nLen,0x10);
      pPager->zJournal[(ulong)nLen + 0x10] = '\0';
    }
    sVar3 = unqlitePagerRegisterKvEngine(pPager,pMethods);
    if (sVar3 == 0) {
      if (pPager->is_mem == 0) {
        pPager->iState = 0;
        pPager->iLock = 0;
      }
      else {
        pPager->iState = 5;
        pPager->iLock = 4;
      }
      sVar3 = 0;
      goto LAB_0010b1ce;
    }
  }
LAB_0010b1c3:
  SyMemBackendFree((SyMemBackend *)pDb,pPager);
LAB_0010b1ce:
  if (sVar3 == 0) {
    (pDb->sDB).pJx9 = (jx9 *)0x0;
    sVar3 = 0;
    if (sJx9MPGlobal.nMagic != 0xea1495ba) {
      if (sJx9MPGlobal.pVfs == (jx9_vfs *)0x0) {
        jx9_lib_config(6,&sUnixVfs);
      }
      if ((sJx9MPGlobal.sAllocator.pMethods != (SyMemMethods *)0x0) ||
         (sVar3 = jx9_lib_config(1,0), sVar3 == 0)) {
        sJx9MPGlobal.nMagic = 0xea1495ba;
        sVar3 = 0;
      }
    }
    if (sVar3 == 0) {
      pBackend = (jx9 *)SyMemBackendPoolAlloc(&sJx9MPGlobal.sAllocator,0x118);
      if (pBackend == (jx9 *)0x0) {
        sVar3 = -1;
      }
      else {
        memset(pBackend,0,0x118);
        pBackend->nMagic = 0xf874bcd7;
        sVar3 = SyMemBackendInitFromParent((SyMemBackend *)pBackend,&sJx9MPGlobal.sAllocator);
        if (sVar3 == 0) {
          (pBackend->xConf).sErrConsumer.pBlob = (void *)0x0;
          (pBackend->xConf).sErrConsumer.nByte = 0;
          (pBackend->xConf).sErrConsumer.mByte = 0;
          (pBackend->xConf).sErrConsumer.pAllocator = (SyMemBackend *)pBackend;
          (pBackend->xConf).sErrConsumer.nFlags = 0;
          (pBackend->xConf).xErr = jx9VmBlobConsumer;
          (pBackend->xConf).pErrData = &(pBackend->xConf).sErrConsumer;
          pBackend->pVfs = sJx9MPGlobal.pVfs;
          if (sJx9MPGlobal.pEngines != (jx9 *)0x0) {
            pBackend->pNext = sJx9MPGlobal.pEngines;
            (sJx9MPGlobal.pEngines)->pPrev = pBackend;
          }
          sJx9MPGlobal.nEngine = sJx9MPGlobal.nEngine + 1;
          sJx9MPGlobal.pEngines = pBackend;
          (pDb->sDB).pJx9 = pBackend;
          sVar3 = 0;
        }
        else {
          SyMemBackendRelease((SyMemBackend *)pBackend);
          SyMemBackendPoolFree(&sJx9MPGlobal.sAllocator,pBackend);
        }
      }
    }
  }
  if (sVar3 == 0) {
    if (sUnqlMPGlobal.pDB != (unqlite *)0x0) {
      pDb->pNext = sUnqlMPGlobal.pDB;
      (sUnqlMPGlobal.pDB)->pPrev = pDb;
    }
    sUnqlMPGlobal.nDB = sUnqlMPGlobal.nDB + 1;
    sUnqlMPGlobal.pDB = pDb;
    pDb->nMagic = 0xdb7c2712;
    *ppDB = pDb;
    sVar3 = 0;
  }
  else {
    SyMemBackendRelease((SyMemBackend *)pDb);
    SyMemBackendPoolFree(&sUnqlMPGlobal.sAllocator,pDb);
  }
  return sVar3;
}

Assistant:

int unqlite_open(unqlite **ppDB,const char *zFilename,unsigned int iMode)
{
	unqlite *pHandle;
	int rc;
#if defined(UNTRUST)
	if( ppDB == 0 ){
		return UNQLITE_CORRUPT;
	}
#endif
	*ppDB = 0;
	/* One-time automatic library initialization */
	rc = unqliteCoreInitialize();
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Allocate a new database handle */
	pHandle = (unqlite *)SyMemBackendPoolAlloc(&sUnqlMPGlobal.sAllocator, sizeof(unqlite));
	if( pHandle == 0 ){
		return UNQLITE_NOMEM;
	}
	/* Zero the structure */
	SyZero(pHandle,sizeof(unqlite));
	if( iMode < 1 ){
		/* Assume a read-only database */
		iMode = UNQLITE_OPEN_READONLY|UNQLITE_OPEN_MMAP;
	}
	/* Init the database */
	rc = unqliteInitDatabase(pHandle,&sUnqlMPGlobal.sAllocator,zFilename,iMode);
	if( rc != UNQLITE_OK ){
		goto Release;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	if( !(iMode & UNQLITE_OPEN_NOMUTEX) && (sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE) ){
		 /* Associate a recursive mutex with this instance */
		 pHandle->pMutex = SyMutexNew(sUnqlMPGlobal.pMutexMethods, SXMUTEX_TYPE_RECURSIVE);
		 if( pHandle->pMutex == 0 ){
			 rc = UNQLITE_NOMEM;
			 goto Release;
		 }
	 }
#endif
	/* Link to the list of active DB handles */
#if defined(UNQLITE_ENABLE_THREADS)
	/* Enter the global mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, sUnqlMPGlobal.pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel == UNQLITE_THREAD_LEVEL_SINGLE */
#endif
	 MACRO_LD_PUSH(sUnqlMPGlobal.pDB,pHandle);
	 sUnqlMPGlobal.nDB++;
#if defined(UNQLITE_ENABLE_THREADS)
	/* Leave the global mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods, sUnqlMPGlobal.pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel == UNQLITE_THREAD_LEVEL_SINGLE */
#endif
	/* Set the magic number to identify a valid DB handle */
	 pHandle->nMagic = UNQLITE_DB_MAGIC;
	/* Make the handle available to the caller */
	*ppDB = pHandle;
	return UNQLITE_OK;
Release:
	SyMemBackendRelease(&pHandle->sMem);
	SyMemBackendPoolFree(&sUnqlMPGlobal.sAllocator,pHandle);
	return rc;
}